

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void PatternMatch_CStyleParam(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  kNameSpace *stmt;
  uintptr_t uVar2;
  kFunc *pkVar3;
  long lVar4;
  KClass *pKVar5;
  kObjectVar *tokenList;
  kmagicflag_t kVar6;
  uint uVar7;
  ulong uVar8;
  kNode *o;
  uintptr_t uVar9;
  kNameSpace *pkVar10;
  ulong uVar11;
  int iVar12;
  kNameSpace *ns;
  long lVar13;
  KTokenSeq param;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  stmt = (kNameSpace *)sfp[1].field_0.asException;
  uVar2 = sfp[2].field_1.unboxValue;
  pkVar3 = sfp[3].field_0.asFunc;
  uVar9 = sfp[4].field_1.unboxValue;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_CStyleParam",0x477,"tracing..");
  lVar13 = uVar9 << 0x20;
  lVar4 = *(long *)((long)&(pkVar3->env->h).magicflag + (lVar13 >> 0x1d));
  uVar9 = 0xffffffffffffffff;
  if (*(int *)(*(long *)(lVar4 + 0x38) + 0x20) == 7) {
    pKVar5 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
    pkVar10 = stmt;
    do {
      ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar10->importedNameSpaceList)->
           StmtNameSpace;
      if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar10->importedNameSpaceList)->
           StmtNameSpace->h).ct == pKVar5) break;
      pkVar10 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar10->packageId)->RootNodeNameSpace;
      ns = pkVar10;
    } while ((pkVar10->h).ct != pKVar5);
    tokenList = *(kObjectVar **)(lVar4 + 0x20);
    local_50 = 1;
    uVar7 = (uint)((tokenList->field_1).fieldUnboxItems[0] >> 3);
    local_4c = uVar7 - 1;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    if (0 < (int)local_4c) {
      uVar11 = (ulong)local_4c;
      uVar8 = 0;
      iVar12 = 0;
      do {
        kVar6 = (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar8];
        iVar1 = *(int *)(kVar6 + 0x30);
        if (iVar1 == 0x20) {
          *(undefined8 *)(kVar6 + 0x38) =
               *(undefined8 *)(*(long *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0) + 0x38)
          ;
          iVar12 = iVar12 + 1;
        }
        else if (iVar1 == 0x29) {
          local_4c = (uint)uVar8;
          goto LAB_00116d52;
        }
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
      if (local_4c != 1 && iVar12 == 0) {
        (*(kctx->platApi->GCModule).UpdateObjectField)
                  (tokenList,
                   (kObjectVar *)(&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar11],
                   *(kObjectVar **)((*kctx->runtimeModels)[1].setupModelContext + 0xc0));
        (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar11] =
             *(kmagicflag_t *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0);
        local_4c = uVar7;
      }
    }
LAB_00116d52:
    o = ParseNewNode(kctx,ns,(kArray *)tokenList,&local_50,local_4c,ParseMetaPatternOption,
                     (char *)0x0);
    kNode_AddParsedObject(kctx,(kNode *)stmt,(ksymbol_t)uVar2,(kObject_conflict *)o);
    uVar9 = lVar13 + 0x100000000 >> 0x20;
  }
  sfp[-4].field_1.unboxValue = uVar9;
  return;
}

Assistant:

static KMETHOD PatternMatch_CStyleParam(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = -1;
	kToken *tk = tokenList->TokenItems[beginIdx];
	if(tk->resolvedSyntaxInfo->keyword == KSymbol_ParenthesisGroup) {
		KTokenSeq param = {kNode_ns(stmt), RangeGroup(tk->GroupTokenList)};
		CheckCStyleParam(kctx, &param);
		kNode *block = ParseNewNode(kctx, param.ns, param.tokenList, &param.beginIdx, param.endIdx, ParseMetaPatternOption, NULL);
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(block));
		returnIdx = beginIdx + 1;
	}
	KReturnUnboxValue(returnIdx);
}